

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2i.c
# Opt level: O0

int Int2_ManChainStart(Int2_Man_t *p,clause *c)

{
  Vec_Int_t *p_00;
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  Gia_Obj_t *pObj;
  clause local_30;
  int Res;
  int CiId;
  int Var;
  int i;
  clause *c_local;
  Int2_Man_t *p_local;
  
  if (((uint)*c & 1) == 0) {
    if (((uint)*c >> 2 & 1) == 0) {
      p_local._4_4_ = (clause)0x1;
    }
    else {
      if ((int)c[(ulong)((uint)*c >> 0xb) + 1] < 0) {
        local_30 = (clause)0x0;
        for (CiId = 0; CiId < (int)((uint)*c >> 0xb); CiId = CiId + 1) {
          iVar2 = Abc_Lit2Var((int)c[(long)CiId + 1]);
          iVar3 = Vec_IntSize(p->vVar2Glo);
          if (iVar2 < iVar3) {
            p_00 = p->vVar2Glo;
            iVar2 = Abc_Lit2Var((int)c[(long)CiId + 1]);
            iVar2 = Vec_IntEntry(p_00,iVar2);
            if (-1 < iVar2) {
              pGVar1 = p->pGia;
              pObj = Gia_ManCi(p->pGia,iVar2);
              iVar2 = Gia_ObjId(pGVar1,pObj);
              pGVar1 = p->pGia;
              iVar3 = Abc_LitIsCompl((int)c[(long)CiId + 1]);
              iVar2 = Abc_Var2Lit(iVar2,iVar3);
              local_30 = (clause)Gia_ManHashOr(pGVar1,(int)local_30,iVar2);
            }
          }
        }
        c[(ulong)((uint)*c >> 0xb) + 1] = local_30;
      }
      p_local._4_4_ = c[(ulong)((uint)*c >> 0xb) + 1];
    }
  }
  else {
    piVar4 = veci_begin(&p->pSat->claProofs);
    iVar2 = clause_id(c);
    p_local._4_4_ = *(clause *)(piVar4 + iVar2);
  }
  return (int)p_local._4_4_;
}

Assistant:

int Int2_ManChainStart( Int2_Man_t * p, clause * c )
{
    if ( c->lrn )
        return veci_begin(&p->pSat->claProofs)[clause_id(c)];
    if ( !c->partA )
        return 1;
    if ( c->lits[c->size] < 0 )
    {
        int i, Var, CiId, Res = 0;
        for ( i = 0; i < (int)c->size; i++ )
        {
            // get ID of the global variable
            if ( Abc_Lit2Var(c->lits[i]) >= Vec_IntSize(p->vVar2Glo) )
                continue;
            Var = Vec_IntEntry( p->vVar2Glo, Abc_Lit2Var(c->lits[i]) );
            if ( Var < 0 )
                continue;
            // get literal of the AIG node
            CiId = Gia_ObjId( p->pGia, Gia_ManCi(p->pGia, Var) );
            // compute interpolant of the clause
            Res = Gia_ManHashOr( p->pGia, Res, Abc_Var2Lit(CiId, Abc_LitIsCompl(c->lits[i])) );
        }
        c->lits[c->size] = Res;
    }
    return c->lits[c->size];
}